

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall
HModel::util_getPrimalDualValues
          (HModel *this,vector<double,_std::allocator<double>_> *colValue,
          vector<double,_std::allocator<double>_> *colDual,
          vector<double,_std::allocator<double>_> *rowValue,
          vector<double,_std::allocator<double>_> *rowDual)

{
  uint uVar1;
  int iVar2;
  pointer pdVar3;
  pointer piVar4;
  size_type __new_size;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  vector<double,_std::allocator<double>_> dual;
  vector<double,_std::allocator<double>_> value;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,&this->workValue);
  pdVar3 = (this->baseValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar5 = (ulong)(uint)this->numRow;
  if (this->numRow < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    local_48._M_impl.super__Vector_impl_data._M_start[piVar4[uVar6]] = pdVar3[uVar6];
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_60,&this->workDual);
  piVar4 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar5 = (ulong)(uint)this->numRow;
  if (this->numRow < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    local_60._M_impl.super__Vector_impl_data._M_start[piVar4[uVar6]] = 0.0;
  }
  uVar1 = this->numCol;
  __new_size = (size_type)(int)uVar1;
  pdVar3 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    local_48._M_impl.super__Vector_impl_data._M_start[uVar6] =
         pdVar3[uVar6] * local_48._M_impl.super__Vector_impl_data._M_start[uVar6];
    local_60._M_impl.super__Vector_impl_data._M_start[uVar6] =
         local_60._M_impl.super__Vector_impl_data._M_start[uVar6] / pdVar3[uVar6];
  }
  pdVar3 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    local_48._M_impl.super__Vector_impl_data._M_start[__new_size + uVar6] =
         local_48._M_impl.super__Vector_impl_data._M_start[__new_size + uVar6] / pdVar3[uVar6];
    local_60._M_impl.super__Vector_impl_data._M_start[__new_size + uVar6] =
         pdVar3[uVar6] * local_60._M_impl.super__Vector_impl_data._M_start[__new_size + uVar6];
  }
  std::vector<double,_std::allocator<double>_>::resize(colValue,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(colDual,(long)this->numCol);
  std::vector<double,_std::allocator<double>_>::resize(rowValue,(long)this->numRow);
  std::vector<double,_std::allocator<double>_>::resize(rowDual,(long)this->numRow);
  iVar2 = this->numCol;
  pdVar3 = (rowValue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar5 = (ulong)(uint)this->numRow;
  if (this->numRow < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    pdVar3[uVar6] = -local_48._M_impl.super__Vector_impl_data._M_start[(long)iVar2 + uVar6];
  }
  uVar1 = this->numCol;
  pdVar3 = (colValue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    pdVar3[uVar7] = local_48._M_impl.super__Vector_impl_data._M_start[uVar7];
  }
  iVar2 = this->objSense;
  pdVar3 = (rowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    pdVar3[uVar7] =
         local_60._M_impl.super__Vector_impl_data._M_start[(long)(int)uVar1 + uVar7] * (double)iVar2
    ;
  }
  iVar2 = this->objSense;
  pdVar3 = (colDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    pdVar3[uVar5] = local_60._M_impl.super__Vector_impl_data._M_start[uVar5] * (double)iVar2;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void HModel::util_getPrimalDualValues(vector<double>& colValue, vector<double>& colDual,
				      vector<double>& rowValue, vector<double>& rowDual) {
	// Take primal solution
	vector<double> value = workValue;
	for (int iRow = 0; iRow < numRow; iRow++)
		value[basicIndex[iRow]] = baseValue[iRow];
	// Take dual solution
	vector<double> dual = workDual;
	for (int iRow = 0; iRow < numRow; iRow++)
		dual[basicIndex[iRow]] = 0;
	// Scale back 
	for (int iCol = 0; iCol < numCol; iCol++) {
		value[iCol] *= colScale[iCol];
		dual[iCol] /= colScale[iCol];

	}
	for (int iRow = 0, iTot = numCol; iRow < numRow; iRow++, iTot++) {
		value[iTot] /= rowScale[iRow];
		dual[iTot] *= rowScale[iRow];
	}
	
	//************** part 2: gepr and gedu
	// Now we can get the solution
	colValue.resize(numCol);
	colDual.resize(numCol); 
	rowValue.resize(numRow);
	rowDual.resize(numRow);
 
	double *valuePtr = &value[0];
    for (int i = 0; i < numRow; i++)
        rowValue[i] = -valuePtr[i + numCol];
    for (int i = 0; i < numCol; i++)
        colValue[i] = valuePtr[i];
    for (int i = 0; i < numRow; i++)
        rowDual[i] = objSense*dual[i + numCol];
    for (int i = 0; i < numCol; i++)
        colDual[i] = objSense*dual[i];
}